

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_map.h
# Opt level: O1

void __thiscall cppcms::impl::string_map::add(string_map *this,char *key,char *value)

{
  string_map *d;
  pointer peVar1;
  pointer peVar2;
  pointer peVar3;
  uint uVar4;
  int iVar5;
  byte bVar6;
  long lVar7;
  byte *pbVar8;
  int new_first;
  entry new_entry;
  allocator_type local_5d;
  int local_5c;
  vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_> local_58
  ;
  entry local_40;
  
  bVar6 = *key;
  if (bVar6 == 0) {
    local_40.hash = 0;
  }
  else {
    pbVar8 = (byte *)(key + 1);
    local_40.hash = 0;
    do {
      uVar4 = (uint)bVar6 + local_40.hash * 0x10;
      local_40.hash = uVar4 & 0xfffffff ^ uVar4 >> 0x18 & 0xfffffff0;
      bVar6 = *pbVar8;
      pbVar8 = pbVar8 + 1;
    } while (bVar6 != 0);
  }
  local_40.next_index = 0;
  d = this + 0x10;
  lVar7 = *(long *)(this + 0x18) - *(long *)(this + 0x10) >> 3;
  local_40.key = key;
  local_40.value = value;
  if ((ulong)(lVar7 * -0x5555555555555555) <= (ulong)(*(long *)(this + 8) * 2)) {
    local_5c = -1;
    std::vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>::
    vector(&local_58,lVar7 * 0x5555555555555556,&local_5d);
    iVar5 = *(int *)this;
    if (iVar5 != -1) {
      do {
        insert(&local_58,(entry *)(*(long *)d + (long)iVar5 * 0x18),&local_5c);
        iVar5 = *(int *)(*(long *)d + 0x14 + (long)iVar5 * 0x18);
      } while (iVar5 != -1);
    }
    *(int *)this = local_5c;
    peVar1 = *(pointer *)(this + 0x10);
    peVar2 = *(pointer *)(this + 0x18);
    peVar3 = *(pointer *)(this + 0x20);
    *(pointer *)(this + 0x10) =
         local_58.
         super__Vector_base<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
         ._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)(this + 0x18) =
         local_58.
         super__Vector_base<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)(this + 0x20) =
         local_58.
         super__Vector_base<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_58.
    super__Vector_base<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
    ._M_impl.super__Vector_impl_data._M_start = peVar1;
    local_58.
    super__Vector_base<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
    ._M_impl.super__Vector_impl_data._M_finish = peVar2;
    local_58.
    super__Vector_base<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = peVar3;
    if (peVar1 != (pointer)0x0) {
      operator_delete(peVar1);
    }
  }
  insert((vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
          *)d,&local_40,(int *)this);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  return;
}

Assistant:

void add(char const *key,char const *value) {
				entry new_entry(key,value);
				if(total_ * 2 >= data_.size()) {
					int new_first = -1;
					std::vector<entry> new_data(data_.size()*2);
					for(iterator p = begin(),e = end();p!=e;++p) {
						insert(new_data,*p,new_first);
					}
					first_ = new_first;
					data_.swap(new_data);
				}
				insert(data_,new_entry,first_);
				total_++;
			}